

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  int iVar1;
  float *pfVar2;
  unsigned_short *puVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float *pfVar10;
  ImFontGlyph *pIVar11;
  ImFontGlyph *pIVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  int n;
  long lVar17;
  ushort uVar18;
  int iVar19;
  int iVar20;
  float fVar21;
  ImWchar dots_chars [2];
  ImWchar ellipsis_chars [2];
  ushort local_30 [4];
  
  uVar13 = (ulong)(uint)(this->Glyphs).Size;
  if (uVar13 == 0) {
    uVar16 = 1;
  }
  else {
    lVar14 = 0;
    uVar16 = 0;
    do {
      uVar15 = *(uint *)(&((this->Glyphs).Data)->field_0x0 + lVar14) >> 2;
      if (uVar15 < uVar16) {
        uVar15 = uVar16;
      }
      uVar16 = uVar15;
      lVar14 = lVar14 + 0x28;
    } while (uVar13 * 0x28 != lVar14);
    uVar16 = uVar16 + 1;
  }
  pfVar2 = (this->IndexAdvanceX).Data;
  if (pfVar2 != (float *)0x0) {
    (this->IndexAdvanceX).Size = 0;
    (this->IndexAdvanceX).Capacity = 0;
    ImGui::MemFree(pfVar2);
    (this->IndexAdvanceX).Data = (float *)0x0;
  }
  puVar3 = (this->IndexLookup).Data;
  if (puVar3 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(puVar3);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  this->DirtyLookupTables = false;
  this->Used4kPagesMap[0] = '\0';
  this->Used4kPagesMap[1] = '\0';
  GrowIndex(this,uVar16);
  iVar1 = (this->Glyphs).Size;
  lVar14 = (long)iVar1;
  if (0 < lVar14) {
    pfVar2 = (this->IndexAdvanceX).Data;
    puVar3 = (this->IndexLookup).Data;
    pfVar10 = &((this->Glyphs).Data)->AdvanceX;
    lVar17 = 0;
    do {
      uVar15 = *(uint *)(pfVar10 + -1);
      *(float *)((long)pfVar2 + (ulong)(uVar15 & 0xfffffffc)) = *pfVar10;
      puVar3[uVar15 >> 2] = (unsigned_short)lVar17;
      this->Used4kPagesMap[uVar15 >> 0x11] =
           this->Used4kPagesMap[uVar15 >> 0x11] | (byte)(1 << ((byte)(uVar15 >> 0xe) & 7));
      lVar17 = lVar17 + 1;
      pfVar10 = pfVar10 + 10;
    } while (lVar14 != lVar17);
  }
  uVar15 = (this->IndexLookup).Size;
  if ((uVar15 < 0x21) || (uVar18 = (this->IndexLookup).Data[0x20], uVar18 == 0xffff)) {
    pIVar11 = this->FallbackGlyph;
  }
  else {
    pIVar11 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar18 * 0x28);
  }
  if (pIVar11 != (ImFontGlyph *)0x0) {
    pIVar11 = (this->Glyphs).Data;
    if (((undefined1  [40])pIVar11[lVar14 + -1] & (undefined1  [40])0xfffffffc) !=
        (undefined1  [40])0x24) {
      iVar20 = iVar1 + 1;
      iVar19 = (this->Glyphs).Capacity;
      if (iVar19 <= iVar1) {
        if (iVar19 == 0) {
          iVar19 = 8;
        }
        else {
          iVar19 = iVar19 / 2 + iVar19;
        }
        if (iVar19 <= iVar20) {
          iVar19 = iVar20;
        }
        pIVar11 = (ImFontGlyph *)ImGui::MemAlloc((long)iVar19 * 0x28);
        pIVar12 = (this->Glyphs).Data;
        if (pIVar12 != (ImFontGlyph *)0x0) {
          memcpy(pIVar11,pIVar12,(long)(this->Glyphs).Size * 0x28);
          ImGui::MemFree((this->Glyphs).Data);
        }
        (this->Glyphs).Data = pIVar11;
        (this->Glyphs).Capacity = iVar19;
        uVar15 = (this->IndexLookup).Size;
      }
      (this->Glyphs).Size = iVar20;
      lVar14 = (long)iVar20;
    }
    if ((uVar15 < 0x21) || (uVar13 = (ulong)(this->IndexLookup).Data[0x20], uVar13 == 0xffff)) {
      pIVar12 = this->FallbackGlyph;
    }
    else {
      pIVar12 = pIVar11 + uVar13;
    }
    fVar21 = pIVar12->V1;
    pIVar11[lVar14 + -1].U1 = pIVar12->U1;
    pIVar11[lVar14 + -1].V1 = fVar21;
    uVar6 = *(undefined4 *)&pIVar12->field_0x0;
    fVar7 = pIVar12->AdvanceX;
    fVar8 = pIVar12->X0;
    fVar9 = pIVar12->Y0;
    fVar21 = pIVar12->Y1;
    fVar4 = pIVar12->U0;
    fVar5 = pIVar12->V0;
    pIVar11[lVar14 + -1].X1 = pIVar12->X1;
    pIVar11[lVar14 + -1].Y1 = fVar21;
    pIVar11[lVar14 + -1].U0 = fVar4;
    pIVar11[lVar14 + -1].V0 = fVar5;
    *(undefined4 *)&pIVar11[lVar14 + -1].field_0x0 = uVar6;
    pIVar11[lVar14 + -1].AdvanceX = fVar7;
    pIVar11[lVar14 + -1].X0 = fVar8;
    pIVar11[lVar14 + -1].Y0 = fVar9;
    *(uint *)(pIVar11 + lVar14 + -1) = *(uint *)(pIVar11 + lVar14 + -1) & 3 | 0x24;
    fVar21 = pIVar11[lVar14 + -1].AdvanceX * 4.0;
    pIVar11[lVar14 + -1].AdvanceX = fVar21;
    (this->IndexAdvanceX).Data[9] = fVar21;
    (this->IndexLookup).Data[*(uint *)(pIVar11 + lVar14 + -1) >> 2] = (short)(this->Glyphs).Size - 1
    ;
    uVar15 = (this->IndexLookup).Size;
  }
  if ((uVar15 < 0x21) || (uVar18 = (this->IndexLookup).Data[0x20], uVar18 == 0xffff)) {
    pIVar11 = this->FallbackGlyph;
  }
  else {
    pIVar11 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar18 * 0x28);
  }
  if (pIVar11 != (ImFontGlyph *)0x0) {
    *(byte *)pIVar11 = *(byte *)pIVar11 & 0xfd;
    uVar15 = (this->IndexLookup).Size;
  }
  if ((uVar15 < 10) || (uVar18 = (this->IndexLookup).Data[9], uVar18 == 0xffff)) {
    pIVar11 = this->FallbackGlyph;
  }
  else {
    pIVar11 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar18 * 0x28);
  }
  if (pIVar11 != (ImFontGlyph *)0x0) {
    *(byte *)pIVar11 = *(byte *)pIVar11 & 0xfd;
    uVar15 = (this->IndexLookup).Size;
  }
  local_30[2] = 0x2026;
  local_30[3] = 0x85;
  local_30[0] = 0x2e;
  local_30[1] = 0xff0e;
  puVar3 = (this->IndexLookup).Data;
  uVar13 = (ulong)(int)uVar15;
  if (this->EllipsisChar == 0xffff) {
    lVar14 = 0;
    do {
      uVar18 = local_30[lVar14 + 2];
      if (((uVar18 < uVar13) && (puVar3[uVar18] != 0xffff)) &&
         ((this->Glyphs).Data != (ImFontGlyph *)0x0)) goto LAB_00132cc7;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 2);
    uVar18 = 0xffff;
LAB_00132cc7:
    this->EllipsisChar = uVar18;
  }
  if (this->DotChar == 0xffff) {
    lVar14 = 0;
    do {
      uVar18 = local_30[lVar14];
      if (((uVar18 < uVar13) && (puVar3[uVar18] != 0xffff)) &&
         ((this->Glyphs).Data != (ImFontGlyph *)0x0)) goto LAB_00132d00;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 2);
    uVar18 = 0xffff;
LAB_00132d00:
    this->DotChar = uVar18;
  }
  if ((this->FallbackChar < uVar13) && ((ulong)puVar3[this->FallbackChar] != 0xffff)) {
    pIVar11 = (this->Glyphs).Data;
    pIVar12 = pIVar11 + puVar3[this->FallbackChar];
    this->FallbackGlyph = pIVar12;
    if (pIVar11 != (ImFontGlyph *)0x0) goto LAB_00132dd4;
    pIVar11 = (ImFontGlyph *)0x0;
  }
  else {
    this->FallbackGlyph = (ImFontGlyph *)0x0;
    pIVar11 = (this->Glyphs).Data;
  }
  lVar14 = 0;
  do {
    uVar18 = *(ushort *)((long)&DAT_00165872 + lVar14);
    if ((uVar18 < uVar13) && (puVar3[uVar18] != 0xffff && pIVar11 != (ImFontGlyph *)0x0))
    goto LAB_00132d8b;
    lVar14 = lVar14 + 2;
  } while (lVar14 != 6);
  uVar18 = 0xffff;
LAB_00132d8b:
  this->FallbackChar = uVar18;
  if ((uVar18 < uVar13) && ((ulong)puVar3[uVar18] != 0xffff)) {
    pIVar12 = pIVar11 + puVar3[uVar18];
    this->FallbackGlyph = pIVar12;
    if (pIVar11 != (ImFontGlyph *)0x0) goto LAB_00132dd4;
    pIVar11 = (ImFontGlyph *)0x0;
  }
  pIVar12 = pIVar11 + (long)(this->Glyphs).Size + -1;
  this->FallbackGlyph = pIVar12;
  this->FallbackChar = (ImWchar)(*(uint *)pIVar12 >> 2);
LAB_00132dd4:
  fVar21 = pIVar12->AdvanceX;
  this->FallbackAdvanceX = fVar21;
  pfVar2 = (this->IndexAdvanceX).Data;
  uVar13 = 0;
  do {
    pfVar10 = pfVar2 + uVar13;
    if (*pfVar10 <= 0.0 && *pfVar10 != 0.0) {
      pfVar2[uVar13] = fVar21;
    }
    uVar13 = uVar13 + 1;
  } while (uVar16 != uVar13);
  return;
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Note that 0x2026 is rarely included in our font ranges. Because of this we are more likely to use three individual dots.
    const ImWchar ellipsis_chars[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
    const ImWchar dots_chars[] = { (ImWchar)'.', (ImWchar)0xFF0E };
    if (EllipsisChar == (ImWchar)-1)
        EllipsisChar = FindFirstExistingGlyph(this, ellipsis_chars, IM_ARRAYSIZE(ellipsis_chars));
    if (DotChar == (ImWchar)-1)
        DotChar = FindFirstExistingGlyph(this, dots_chars, IM_ARRAYSIZE(dots_chars));

    // Setup fallback character
    const ImWchar fallback_chars[] = { (ImWchar)IM_UNICODE_CODEPOINT_INVALID, (ImWchar)'?', (ImWchar)' ' };
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    if (FallbackGlyph == NULL)
    {
        FallbackChar = FindFirstExistingGlyph(this, fallback_chars, IM_ARRAYSIZE(fallback_chars));
        FallbackGlyph = FindGlyphNoFallback(FallbackChar);
        if (FallbackGlyph == NULL)
        {
            FallbackGlyph = &Glyphs.back();
            FallbackChar = (ImWchar)FallbackGlyph->Codepoint;
        }
    }

    FallbackAdvanceX = FallbackGlyph->AdvanceX;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}